

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

Range<char> __thiscall Centaurus::CharClass<char>::operator[](CharClass<char> *this,int index)

{
  size_type sVar1;
  const_reference r;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  Range<char> RVar3;
  int index_local;
  CharClass<char> *this_local;
  
  if (-1 < in_EDX) {
    sVar1 = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::size
                      ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
                       (CONCAT44(in_register_00000034,index) + 8));
    if ((ulong)(long)in_EDX < sVar1) {
      r = std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::operator[]
                    ((vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> *)
                     (CONCAT44(in_register_00000034,index) + 8),(long)in_EDX);
      Range<char>::Range((Range<char> *)this,r);
      uVar2 = extraout_RDX;
      goto LAB_001753f5;
    }
  }
  Range<char>::Range((Range<char> *)this);
  uVar2 = extraout_RDX_00;
LAB_001753f5:
  RVar3.m_start = (char)uVar2;
  RVar3.m_end = (char)((ulong)uVar2 >> 8);
  RVar3._10_6_ = (int6)((ulong)uVar2 >> 0x10);
  RVar3._vptr_Range = (_func_int **)this;
  return RVar3;
}

Assistant:

Range<TCHAR> operator[](int index) const
    {
        if (index >= 0 && index < m_ranges.size())
            return m_ranges[index];
        return Range<TCHAR>();
    }